

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Setup
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  CallLogWrapper *this_00;
  
  this->m_vsp = 0;
  if (this->pipeline == true) {
    this->m_vsp = 0;
    this->m_fsp = 0;
    glu::CallLogWrapper::glGenProgramPipelines
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_ppo);
  }
  else {
    this->m_ppo = 0;
  }
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_ssbo);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vbo);
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_vsp = 0;
		if (pipeline)
		{
			m_vsp = m_fsp = 0;
			glGenProgramPipelines(1, &m_ppo);
		}
		else
		{
			m_ppo = 0;
		}
		glGenBuffers(1, &m_ssbo);
		glGenVertexArrays(1, &m_vao);
		glGenBuffers(1, &m_vbo);
		return NO_ERROR;
	}